

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

int __thiscall
CVmObjVector::getp_remove_range(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  size_t sVar2;
  size_t in_RCX;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  vm_val_t *in_RDI;
  int end_idx;
  int start_idx;
  CVmNativeCodeDesc *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_30;
  int local_2c;
  vm_val_t *this_00;
  
  this_00 = in_RDI;
  if ((getp_remove_range(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_remove_range(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_remove_range::desc,2);
    __cxa_guard_release(&getp_remove_range(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_RDI,(uint *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
  if (iVar1 == 0) {
    local_2c = CVmBif::pop_int_val();
    if (local_2c < 0) {
      sVar2 = get_element_count((CVmObjVector *)0x34cb9b);
      local_2c = local_2c + (int)sVar2 + 1;
    }
    if ((local_2c < 1) ||
       (iVar1 = local_2c, sVar2 = get_element_count((CVmObjVector *)0x34cbc7), (int)sVar2 < iVar1))
    {
      err_throw(0);
    }
    local_30 = CVmBif::pop_int_val();
    if (local_30 < 0) {
      sVar2 = get_element_count((CVmObjVector *)0x34cbf6);
      local_30 = local_30 + (int)sVar2 + 1;
    }
    if ((local_30 < local_2c) ||
       (sVar2 = get_element_count((CVmObjVector *)0x34cc25), (int)sVar2 < local_30)) {
      err_throw(0);
    }
    vm_val_t::set_obj(in_RDX,in_ESI);
    remove_elements_undo((CVmObjVector *)this_00,in_ESI,(size_t)in_RDX,in_RCX);
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_remove_range(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *argc)
{
    int start_idx;
    int end_idx;
    static CVmNativeCodeDesc desc(2);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the starting index; a negative value counts from the end */
    start_idx = CVmBif::pop_int_val(vmg0_);
    if (start_idx < 0)
        start_idx += get_element_count() + 1;

    /* 
     *   make sure the index is in range - it must refer to an existing
     *   element 
     */
    if (start_idx < 1 || start_idx > (int)get_element_count())
        err_throw(VMERR_INDEX_OUT_OF_RANGE);

    /* get the ending index, and adjust for negative values */
    end_idx = CVmBif::pop_int_val(vmg0_);
    if (end_idx < 0)
        end_idx += get_element_count() + 1;

    /* 
     *   make sure it's in range - it must refer to an existing element,
     *   and it must be greater than or equal to the starting index 
     */
    if (end_idx < start_idx || end_idx > (int)get_element_count())
        err_throw(VMERR_INDEX_OUT_OF_RANGE);

    /* adjust to zero-based indices */
    --start_idx;
    --end_idx;

    /* the return value is 'self' */
    retval->set_obj(self);

    /* 
     *   delete the elements - the number of elements we're deleting is
     *   one higher than the difference of the starting and ending indices
     *   (if the two indices are the same, we're deleting just the one
     *   element) 
     */
    remove_elements_undo(vmg_ self, start_idx, end_idx - start_idx + 1);

    /* handled */
    return TRUE;
}